

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugXML.c
# Opt level: O2

void xmlCtxtDumpOneNode(xmlDebugCtxtPtr ctxt,xmlNodePtr node)

{
  long lVar1;
  xmlEntityPtr pxVar2;
  xmlElementType xVar3;
  FILE *pFVar4;
  xmlChar *pxVar5;
  int indx;
  int iVar6;
  char *pcVar7;
  xmlNs *pxVar8;
  size_t sStack_13d0;
  char local_13c8 [5000];
  undefined1 local_40;
  
  if (node == (xmlNodePtr)0x0) {
    if (ctxt->check != 0) {
      return;
    }
    xmlCtxtDumpSpaces(ctxt);
    pFVar4 = (FILE *)ctxt->output;
    pcVar7 = "node is NULL\n";
    sStack_13d0 = 0xd;
    goto LAB_00161c7a;
  }
  ctxt->node = node;
  xVar3 = node->type;
  switch(xVar3) {
  case XML_ELEMENT_NODE:
    if (ctxt->check == 0) {
      xmlCtxtDumpSpaces(ctxt);
      fwrite("ELEMENT ",8,1,(FILE *)ctxt->output);
      if ((node->ns != (xmlNs *)0x0) && (pxVar5 = node->ns->prefix, pxVar5 != (xmlChar *)0x0)) {
        xmlCtxtDumpString(ctxt,pxVar5);
        fputc(0x3a,(FILE *)ctxt->output);
      }
      xmlCtxtDumpString(ctxt,node->name);
LAB_001621d5:
      pFVar4 = (FILE *)ctxt->output;
LAB_001621db:
      fputc(10,pFVar4);
    }
    break;
  case XML_ATTRIBUTE_NODE:
    if (ctxt->check == 0) {
      xmlCtxtDumpSpaces(ctxt);
    }
    pFVar4 = (FILE *)ctxt->output;
    pcVar7 = "Error, ATTRIBUTE found here\n";
    sStack_13d0 = 0x1c;
    goto LAB_00161e63;
  case XML_TEXT_NODE:
    if (ctxt->check == 0) {
      xmlCtxtDumpSpaces(ctxt);
      if (node->name == "textnoenc") {
        pcVar7 = "TEXT no enc";
        sStack_13d0 = 0xb;
      }
      else {
        pcVar7 = "TEXT";
        sStack_13d0 = 4;
      }
      fwrite(pcVar7,sStack_13d0,1,(FILE *)ctxt->output);
      if ((ctxt->options & 1) == 0) goto LAB_001621d5;
      if ((_xmlAttr **)node->content == &node->properties) {
        pFVar4 = (FILE *)ctxt->output;
        pcVar7 = " compact\n";
        goto LAB_00161cd7;
      }
      iVar6 = xmlDictOwns(ctxt->dict,node->content);
      pFVar4 = (FILE *)ctxt->output;
      if (iVar6 == 1) {
        pcVar7 = " interned\n";
        sStack_13d0 = 10;
        goto LAB_00161ed1;
      }
      goto LAB_001621db;
    }
    break;
  case XML_CDATA_SECTION_NODE:
    if (ctxt->check == 0) {
      xmlCtxtDumpSpaces(ctxt);
      pFVar4 = (FILE *)ctxt->output;
      pcVar7 = "CDATA_SECTION\n";
LAB_00161e90:
      sStack_13d0 = 0xe;
LAB_00161ed1:
      fwrite(pcVar7,sStack_13d0,1,pFVar4);
    }
    break;
  case XML_ENTITY_REF_NODE:
    if (ctxt->check == 0) {
      xmlCtxtDumpSpaces(ctxt);
      pFVar4 = (FILE *)ctxt->output;
      pxVar5 = node->name;
      pcVar7 = "ENTITY_REF(%s)\n";
LAB_00161f02:
      fprintf(pFVar4,pcVar7,pxVar5);
    }
    break;
  case XML_ENTITY_NODE:
    if (ctxt->check == 0) {
      xmlCtxtDumpSpaces(ctxt);
      pFVar4 = (FILE *)ctxt->output;
      pcVar7 = "ENTITY\n";
      sStack_13d0 = 7;
      goto LAB_00161ed1;
    }
    break;
  case XML_PI_NODE:
    if (ctxt->check == 0) {
      xmlCtxtDumpSpaces(ctxt);
      pFVar4 = (FILE *)ctxt->output;
      pxVar5 = node->name;
      pcVar7 = "PI %s\n";
      goto LAB_00161f02;
    }
    break;
  case XML_COMMENT_NODE:
    if (ctxt->check == 0) {
      xmlCtxtDumpSpaces(ctxt);
      pFVar4 = (FILE *)ctxt->output;
      pcVar7 = "COMMENT\n";
      sStack_13d0 = 8;
      goto LAB_00161ed1;
    }
    break;
  case XML_DOCUMENT_NODE:
  case XML_HTML_DOCUMENT_NODE:
    if (ctxt->check == 0) {
      xmlCtxtDumpSpaces(ctxt);
    }
    pFVar4 = (FILE *)ctxt->output;
    pcVar7 = "Error, DOCUMENT found here\n";
    sStack_13d0 = 0x1b;
LAB_00161e63:
    fwrite(pcVar7,sStack_13d0,1,pFVar4);
    goto LAB_0016241e;
  case XML_DOCUMENT_TYPE_NODE:
    if (ctxt->check == 0) {
      xmlCtxtDumpSpaces(ctxt);
      pFVar4 = (FILE *)ctxt->output;
      pcVar7 = "DOCUMENT_TYPE\n";
      goto LAB_00161e90;
    }
    break;
  case XML_DOCUMENT_FRAG_NODE:
    if (ctxt->check == 0) {
      xmlCtxtDumpSpaces(ctxt);
      pFVar4 = (FILE *)ctxt->output;
      pcVar7 = "DOCUMENT_FRAG\n";
      goto LAB_00161e90;
    }
    break;
  case XML_NOTATION_NODE:
    if (ctxt->check == 0) {
      xmlCtxtDumpSpaces(ctxt);
      pFVar4 = (FILE *)ctxt->output;
      pcVar7 = "NOTATION\n";
LAB_00161cd7:
      sStack_13d0 = 9;
      goto LAB_00161ed1;
    }
    break;
  case XML_DTD_NODE:
    xmlCtxtDumpDtdNode(ctxt,(xmlDtdPtr)node);
    return;
  case XML_ELEMENT_DECL:
    xmlCtxtDumpSpaces(ctxt);
    if (node->type != XML_ELEMENT_DECL) {
      pcVar7 = "Node is not an element declaration";
      iVar6 = 0x13a1;
LAB_00162079:
      xmlDebugErr(ctxt,iVar6,pcVar7);
      return;
    }
    if (node->name == (xmlChar *)0x0) {
      xmlDebugErr(ctxt,0x1397,"Element declaration has no name");
    }
    else if (ctxt->check == 0) {
      fwrite("ELEMDECL(",9,1,(FILE *)ctxt->output);
      xmlCtxtDumpString(ctxt,node->name);
      fputc(0x29,(FILE *)ctxt->output);
    }
    if (ctxt->check != 0) goto LAB_001624e0;
    switch(*(undefined4 *)&node->ns) {
    case 0:
      pFVar4 = (FILE *)ctxt->output;
      pcVar7 = ", UNDEFINED";
      sStack_13d0 = 0xb;
      break;
    case 1:
      pFVar4 = (FILE *)ctxt->output;
      pcVar7 = ", EMPTY";
      sStack_13d0 = 7;
      break;
    case 2:
      pFVar4 = (FILE *)ctxt->output;
      pcVar7 = ", ANY";
      sStack_13d0 = 5;
      break;
    case 3:
    case 4:
      pFVar4 = (FILE *)ctxt->output;
      pcVar7 = ", MIXED ";
      sStack_13d0 = 8;
      break;
    default:
      goto switchD_00162154_default;
    }
    fwrite(pcVar7,sStack_13d0,1,pFVar4);
switchD_00162154_default:
    if ((node->type != XML_ELEMENT_NODE) &&
       ((xmlElementContentPtr)node->content != (xmlElementContentPtr)0x0)) {
      local_13c8[0] = '\0';
      xmlSnprintfElementContent(local_13c8,5000,(xmlElementContentPtr)node->content,1);
      local_40 = 0;
      fputs(local_13c8,(FILE *)ctxt->output);
    }
    fputc(10,(FILE *)ctxt->output);
LAB_001624e0:
    xmlCtxtGenericNodeCheck(ctxt,node);
    return;
  case XML_ATTRIBUTE_DECL:
    xmlCtxtDumpSpaces(ctxt);
    if (node->type != XML_ATTRIBUTE_DECL) {
      pcVar7 = "Node is not an attribute declaration";
      iVar6 = 0x13a0;
      goto LAB_00162079;
    }
    if (node->name == (xmlChar *)0x0) {
      xmlDebugErr(ctxt,0x1397,"Node attribute declaration has no name");
    }
    else if (ctxt->check == 0) {
      fprintf((FILE *)ctxt->output,"ATTRDECL(%s)");
    }
    lVar1._0_2_ = node->line;
    lVar1._2_2_ = node->extra;
    lVar1._4_4_ = *(undefined4 *)&node->field_0x74;
    if (lVar1 == 0) {
      xmlDebugErr(ctxt,0x1398,"Node attribute declaration has no element name");
    }
    else if (ctxt->check == 0) {
      fprintf((FILE *)ctxt->output," for %s");
    }
    if (ctxt->check != 0) goto LAB_0016241e;
    switch(*(undefined4 *)&node->content) {
    case 1:
      pFVar4 = (FILE *)ctxt->output;
      pcVar7 = " CDATA";
      goto LAB_00162606;
    case 2:
      pFVar4 = (FILE *)ctxt->output;
      pcVar7 = " ID";
      sStack_13d0 = 3;
      break;
    case 3:
      pFVar4 = (FILE *)ctxt->output;
      pcVar7 = " IDREF";
LAB_00162606:
      sStack_13d0 = 6;
      break;
    case 4:
      pFVar4 = (FILE *)ctxt->output;
      pcVar7 = " IDREFS";
      goto LAB_00162614;
    case 5:
      pFVar4 = (FILE *)ctxt->output;
      pcVar7 = " ENTITY";
LAB_00162614:
      sStack_13d0 = 7;
      break;
    case 6:
      pFVar4 = (FILE *)ctxt->output;
      pcVar7 = " ENTITIES";
      goto LAB_0016263c;
    case 7:
      pFVar4 = (FILE *)ctxt->output;
      pcVar7 = " NMTOKEN";
      sStack_13d0 = 8;
      break;
    case 8:
      pFVar4 = (FILE *)ctxt->output;
      pcVar7 = " NMTOKENS";
LAB_0016263c:
      sStack_13d0 = 9;
      break;
    case 9:
      pFVar4 = (FILE *)ctxt->output;
      pcVar7 = " ENUMERATION";
      sStack_13d0 = 0xc;
      break;
    case 10:
      pFVar4 = (FILE *)ctxt->output;
      pcVar7 = " NOTATION ";
      sStack_13d0 = 10;
      break;
    default:
      goto switchD_00162106_default;
    }
    fwrite(pcVar7,sStack_13d0,1,pFVar4);
switchD_00162106_default:
    pxVar8 = node->nsDef;
    if (pxVar8 != (xmlNs *)0x0) {
      iVar6 = 0;
      do {
        if (iVar6 == 0) {
          pcVar7 = " (%s";
        }
        else {
          pcVar7 = "|%s";
          if (iVar6 == 5) {
            fwrite("...)",4,1,(FILE *)ctxt->output);
            goto LAB_001626c7;
          }
        }
        fprintf((FILE *)ctxt->output,pcVar7,*(undefined8 *)&pxVar8->type);
        pxVar8 = pxVar8->next;
        iVar6 = iVar6 + 1;
      } while (pxVar8 != (_xmlNs *)0x0);
      fputc(0x29,(FILE *)ctxt->output);
    }
LAB_001626c7:
    iVar6 = *(int *)((long)&node->content + 4);
    if (iVar6 == 4) {
      pFVar4 = (FILE *)ctxt->output;
      pcVar7 = " FIXED";
      sStack_13d0 = 6;
LAB_00162702:
      fwrite(pcVar7,sStack_13d0,1,pFVar4);
    }
    else {
      if (iVar6 == 3) {
        pFVar4 = (FILE *)ctxt->output;
        pcVar7 = " IMPLIED";
        sStack_13d0 = 8;
        goto LAB_00162702;
      }
      if (iVar6 == 2) {
        pFVar4 = (FILE *)ctxt->output;
        pcVar7 = " REQUIRED";
        sStack_13d0 = 9;
        goto LAB_00162702;
      }
    }
    if (node->properties != (_xmlAttr *)0x0) {
      fputc(0x22,(FILE *)ctxt->output);
      xmlCtxtDumpString(ctxt,(xmlChar *)node->properties);
      fputc(0x22,(FILE *)ctxt->output);
    }
LAB_00162735:
    fputc(10,(FILE *)ctxt->output);
    goto LAB_0016241e;
  case XML_ENTITY_DECL:
    xmlCtxtDumpSpaces(ctxt);
    if (node->type != XML_ENTITY_DECL) {
      pcVar7 = "Node is not an entity declaration";
      iVar6 = 0x13a2;
      goto LAB_00162079;
    }
    if (node->name == (xmlChar *)0x0) {
      xmlDebugErr(ctxt,0x1397,"Entity declaration has no name");
    }
    else if (ctxt->check == 0) {
      fwrite("ENTITYDECL(",0xb,1,(FILE *)ctxt->output);
      xmlCtxtDumpString(ctxt,node->name);
      fputc(0x29,(FILE *)ctxt->output);
    }
    if (ctxt->check != 0) goto LAB_0016241e;
    switch(*(undefined4 *)((long)&node->properties + 4)) {
    case 1:
      pFVar4 = (FILE *)ctxt->output;
      pcVar7 = ", internal\n";
      goto LAB_00162508;
    case 2:
      pFVar4 = (FILE *)ctxt->output;
      pcVar7 = ", external parsed\n";
      sStack_13d0 = 0x12;
      break;
    case 3:
      pFVar4 = (FILE *)ctxt->output;
      pcVar7 = ", unparsed\n";
LAB_00162508:
      sStack_13d0 = 0xb;
      break;
    case 4:
      pFVar4 = (FILE *)ctxt->output;
      pcVar7 = ", parameter\n";
      sStack_13d0 = 0xc;
      break;
    case 5:
      pFVar4 = (FILE *)ctxt->output;
      pcVar7 = ", external parameter\n";
      sStack_13d0 = 0x15;
      break;
    case 6:
      pFVar4 = (FILE *)ctxt->output;
      pcVar7 = ", predefined\n";
      sStack_13d0 = 0xd;
      break;
    default:
      goto switchD_001621a5_default;
    }
    fwrite(pcVar7,sStack_13d0,1,pFVar4);
switchD_001621a5_default:
    if (node->nsDef != (xmlNs *)0x0) {
      xmlCtxtDumpSpaces(ctxt);
      fprintf((FILE *)ctxt->output," ExternalID=%s\n",node->nsDef);
    }
    if (node->psvi != (void *)0x0) {
      xmlCtxtDumpSpaces(ctxt);
      fprintf((FILE *)ctxt->output," SystemID=%s\n",node->psvi);
    }
    if (node[1]._private != (void *)0x0) {
      xmlCtxtDumpSpaces(ctxt);
      fprintf((FILE *)ctxt->output," URI=%s\n",node[1]._private);
    }
    if (node->content == (xmlChar *)0x0) goto LAB_0016241e;
    xmlCtxtDumpSpaces(ctxt);
    fwrite(" content=",9,1,(FILE *)ctxt->output);
    xmlCtxtDumpString(ctxt,node->content);
    goto LAB_00162735;
  case XML_NAMESPACE_DECL:
    xmlCtxtDumpNamespace(ctxt,(xmlNsPtr)node);
    return;
  case XML_XINCLUDE_START:
    if (ctxt->check != 0) {
      return;
    }
    xmlCtxtDumpSpaces(ctxt);
    pFVar4 = (FILE *)ctxt->output;
    pcVar7 = "INCLUDE START\n";
    sStack_13d0 = 0xe;
    goto LAB_00161c7a;
  case XML_XINCLUDE_END:
    if (ctxt->check != 0) {
      return;
    }
    xmlCtxtDumpSpaces(ctxt);
    pFVar4 = (FILE *)ctxt->output;
    pcVar7 = "INCLUDE END\n";
    sStack_13d0 = 0xc;
LAB_00161c7a:
    fwrite(pcVar7,sStack_13d0,1,pFVar4);
    return;
  default:
    if (ctxt->check == 0) {
      xmlCtxtDumpSpaces(ctxt);
      xVar3 = node->type;
    }
    xmlDebugErr2(ctxt,0x1393,"Unknown node type %d\n",xVar3);
    return;
  }
  if (node->doc == (_xmlDoc *)0x0) {
    if (ctxt->check == 0) {
      xmlCtxtDumpSpaces(ctxt);
    }
    fwrite("PBM: doc == NULL !!!\n",0x15,1,(FILE *)ctxt->output);
  }
  ctxt->depth = ctxt->depth + 1;
  xVar3 = node->type;
  if (xVar3 == XML_ELEMENT_NODE) {
    if (node->nsDef != (xmlNsPtr)0x0) {
      xmlCtxtDumpNamespaceList(ctxt,node->nsDef);
      xVar3 = node->type;
      if (xVar3 != XML_ELEMENT_NODE) goto LAB_0016224c;
    }
    if (node->properties != (xmlAttrPtr)0x0) {
      xmlCtxtDumpAttrList(ctxt,node->properties);
      xVar3 = node->type;
      goto LAB_0016224c;
    }
    goto LAB_0016241b;
  }
LAB_0016224c:
  if (xVar3 == XML_ELEMENT_NODE) goto LAB_0016241b;
  if (xVar3 != XML_ENTITY_REF_NODE) {
    if ((node->content == (xmlChar *)0x0) || (ctxt->check != 0)) goto LAB_0016241b;
    xmlCtxtDumpSpaces(ctxt);
    fwrite("content=",8,1,(FILE *)ctxt->output);
    pxVar5 = node->content;
    goto LAB_00162408;
  }
  pxVar2 = xmlGetDocEntity(node->doc,node->name);
  if ((pxVar2 == (xmlEntityPtr)0x0) || (xmlCtxtDumpSpaces(ctxt), ctxt->check != 0))
  goto LAB_0016241b;
  switch(pxVar2->etype) {
  case XML_INTERNAL_GENERAL_ENTITY:
    pcVar7 = "INTERNAL_GENERAL_ENTITY ";
    sStack_13d0 = 0x18;
    break;
  case XML_EXTERNAL_GENERAL_PARSED_ENTITY:
    pcVar7 = "EXTERNAL_GENERAL_PARSED_ENTITY ";
    sStack_13d0 = 0x1f;
    break;
  case XML_EXTERNAL_GENERAL_UNPARSED_ENTITY:
    pcVar7 = "EXTERNAL_GENERAL_UNPARSED_ENTITY ";
    sStack_13d0 = 0x21;
    break;
  case XML_INTERNAL_PARAMETER_ENTITY:
    pcVar7 = "INTERNAL_PARAMETER_ENTITY ";
    goto LAB_00162349;
  case XML_EXTERNAL_PARAMETER_ENTITY:
    pcVar7 = "EXTERNAL_PARAMETER_ENTITY ";
LAB_00162349:
    sStack_13d0 = 0x1a;
    break;
  default:
    fprintf((FILE *)ctxt->output,"ENTITY_%d ! ");
    goto LAB_0016235f;
  }
  fwrite(pcVar7,sStack_13d0,1,(FILE *)ctxt->output);
LAB_0016235f:
  fprintf((FILE *)ctxt->output,"%s\n",pxVar2->name);
  if (pxVar2->ExternalID != (xmlChar *)0x0) {
    xmlCtxtDumpSpaces(ctxt);
    fprintf((FILE *)ctxt->output,"ExternalID=%s\n",pxVar2->ExternalID);
  }
  if (pxVar2->SystemID != (xmlChar *)0x0) {
    xmlCtxtDumpSpaces(ctxt);
    fprintf((FILE *)ctxt->output,"SystemID=%s\n",pxVar2->SystemID);
  }
  if (pxVar2->URI != (xmlChar *)0x0) {
    xmlCtxtDumpSpaces(ctxt);
    fprintf((FILE *)ctxt->output,"URI=%s\n",pxVar2->URI);
  }
  if (pxVar2->content != (xmlChar *)0x0) {
    xmlCtxtDumpSpaces(ctxt);
    fwrite("content=",8,1,(FILE *)ctxt->output);
    pxVar5 = pxVar2->content;
LAB_00162408:
    xmlCtxtDumpString(ctxt,pxVar5);
    fputc(10,(FILE *)ctxt->output);
  }
LAB_0016241b:
  ctxt->depth = ctxt->depth + -1;
LAB_0016241e:
  xmlCtxtGenericNodeCheck(ctxt,node);
  return;
}

Assistant:

static void
xmlCtxtDumpOneNode(xmlDebugCtxtPtr ctxt, xmlNodePtr node)
{
    if (node == NULL) {
        if (!ctxt->check) {
            xmlCtxtDumpSpaces(ctxt);
            fprintf(ctxt->output, "node is NULL\n");
        }
        return;
    }
    ctxt->node = node;

    switch (node->type) {
        case XML_ELEMENT_NODE:
            if (!ctxt->check) {
                xmlCtxtDumpSpaces(ctxt);
                fprintf(ctxt->output, "ELEMENT ");
                if ((node->ns != NULL) && (node->ns->prefix != NULL)) {
                    xmlCtxtDumpString(ctxt, node->ns->prefix);
                    fprintf(ctxt->output, ":");
                }
                xmlCtxtDumpString(ctxt, node->name);
                fprintf(ctxt->output, "\n");
            }
            break;
        case XML_ATTRIBUTE_NODE:
            if (!ctxt->check)
                xmlCtxtDumpSpaces(ctxt);
            fprintf(ctxt->output, "Error, ATTRIBUTE found here\n");
            xmlCtxtGenericNodeCheck(ctxt, node);
            return;
        case XML_TEXT_NODE:
            if (!ctxt->check) {
                xmlCtxtDumpSpaces(ctxt);
                if (node->name == (const xmlChar *) xmlStringTextNoenc)
                    fprintf(ctxt->output, "TEXT no enc");
                else
                    fprintf(ctxt->output, "TEXT");
		if (ctxt->options & DUMP_TEXT_TYPE) {
		    if (node->content == (xmlChar *) &(node->properties))
			fprintf(ctxt->output, " compact\n");
		    else if (xmlDictOwns(ctxt->dict, node->content) == 1)
			fprintf(ctxt->output, " interned\n");
		    else
			fprintf(ctxt->output, "\n");
		} else
		    fprintf(ctxt->output, "\n");
            }
            break;
        case XML_CDATA_SECTION_NODE:
            if (!ctxt->check) {
                xmlCtxtDumpSpaces(ctxt);
                fprintf(ctxt->output, "CDATA_SECTION\n");
            }
            break;
        case XML_ENTITY_REF_NODE:
            if (!ctxt->check) {
                xmlCtxtDumpSpaces(ctxt);
                fprintf(ctxt->output, "ENTITY_REF(%s)\n",
                        (char *) node->name);
            }
            break;
        case XML_ENTITY_NODE:
            if (!ctxt->check) {
                xmlCtxtDumpSpaces(ctxt);
                fprintf(ctxt->output, "ENTITY\n");
            }
            break;
        case XML_PI_NODE:
            if (!ctxt->check) {
                xmlCtxtDumpSpaces(ctxt);
                fprintf(ctxt->output, "PI %s\n", (char *) node->name);
            }
            break;
        case XML_COMMENT_NODE:
            if (!ctxt->check) {
                xmlCtxtDumpSpaces(ctxt);
                fprintf(ctxt->output, "COMMENT\n");
            }
            break;
        case XML_DOCUMENT_NODE:
        case XML_HTML_DOCUMENT_NODE:
            if (!ctxt->check) {
                xmlCtxtDumpSpaces(ctxt);
            }
            fprintf(ctxt->output, "Error, DOCUMENT found here\n");
            xmlCtxtGenericNodeCheck(ctxt, node);
            return;
        case XML_DOCUMENT_TYPE_NODE:
            if (!ctxt->check) {
                xmlCtxtDumpSpaces(ctxt);
                fprintf(ctxt->output, "DOCUMENT_TYPE\n");
            }
            break;
        case XML_DOCUMENT_FRAG_NODE:
            if (!ctxt->check) {
                xmlCtxtDumpSpaces(ctxt);
                fprintf(ctxt->output, "DOCUMENT_FRAG\n");
            }
            break;
        case XML_NOTATION_NODE:
            if (!ctxt->check) {
                xmlCtxtDumpSpaces(ctxt);
                fprintf(ctxt->output, "NOTATION\n");
            }
            break;
        case XML_DTD_NODE:
            xmlCtxtDumpDtdNode(ctxt, (xmlDtdPtr) node);
            return;
        case XML_ELEMENT_DECL:
            xmlCtxtDumpElemDecl(ctxt, (xmlElementPtr) node);
            return;
        case XML_ATTRIBUTE_DECL:
            xmlCtxtDumpAttrDecl(ctxt, (xmlAttributePtr) node);
            return;
        case XML_ENTITY_DECL:
            xmlCtxtDumpEntityDecl(ctxt, (xmlEntityPtr) node);
            return;
        case XML_NAMESPACE_DECL:
            xmlCtxtDumpNamespace(ctxt, (xmlNsPtr) node);
            return;
        case XML_XINCLUDE_START:
            if (!ctxt->check) {
                xmlCtxtDumpSpaces(ctxt);
                fprintf(ctxt->output, "INCLUDE START\n");
            }
            return;
        case XML_XINCLUDE_END:
            if (!ctxt->check) {
                xmlCtxtDumpSpaces(ctxt);
                fprintf(ctxt->output, "INCLUDE END\n");
            }
            return;
        default:
            if (!ctxt->check)
                xmlCtxtDumpSpaces(ctxt);
	    xmlDebugErr2(ctxt, XML_CHECK_UNKNOWN_NODE,
	                "Unknown node type %d\n", node->type);
            return;
    }
    if (node->doc == NULL) {
        if (!ctxt->check) {
            xmlCtxtDumpSpaces(ctxt);
        }
        fprintf(ctxt->output, "PBM: doc == NULL !!!\n");
    }
    ctxt->depth++;
    if ((node->type == XML_ELEMENT_NODE) && (node->nsDef != NULL))
        xmlCtxtDumpNamespaceList(ctxt, node->nsDef);
    if ((node->type == XML_ELEMENT_NODE) && (node->properties != NULL))
        xmlCtxtDumpAttrList(ctxt, node->properties);
    if (node->type != XML_ENTITY_REF_NODE) {
        if ((node->type != XML_ELEMENT_NODE) && (node->content != NULL)) {
            if (!ctxt->check) {
                xmlCtxtDumpSpaces(ctxt);
                fprintf(ctxt->output, "content=");
                xmlCtxtDumpString(ctxt, node->content);
                fprintf(ctxt->output, "\n");
            }
        }
    } else {
        xmlEntityPtr ent;

        ent = xmlGetDocEntity(node->doc, node->name);
        if (ent != NULL)
            xmlCtxtDumpEntity(ctxt, ent);
    }
    ctxt->depth--;

    /*
     * Do a bit of checking
     */
    xmlCtxtGenericNodeCheck(ctxt, node);
}